

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * antlr::operator+(string *lhs,int rhs)

{
  uint in_EDX;
  string *in_RDI;
  char tmp [100];
  char local_78 [24];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  
  snprintf(local_78,100,"%d",(ulong)in_EDX);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  return in_RDI;
}

Assistant:

string operator+( const ANTLR_USE_NAMESPACE(std)string& lhs, const int rhs )
{
	char tmp[100];
	snprintf(tmp,100,"%d",rhs);
	return lhs+tmp;
}